

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::RandomWalkIntegrator::Li
          (RandomWalkIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  SampledSpectrum SVar6;
  SampledSpectrum b;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_70;
  RayDifferential local_68;
  
  local_68.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x =
       (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
  local_68.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y =
       (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
  uVar3 = *(undefined8 *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
  uVar5 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
  local_68.super_Ray._20_8_ =
       *(undefined8 *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
  local_68.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar3;
  local_68.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)((ulong)uVar3 >> 0x20);
  local_68.super_Ray.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )(ray->super_Ray).medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  local_68.hasDifferentials = ray->hasDifferentials;
  local_68._41_3_ = *(undefined3 *)&ray->field_0x29;
  local_68.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x =
       (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x;
  local_68.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y =
       (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y;
  local_68.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z =
       (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z;
  uVar1 = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x;
  uVar2 = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y;
  uVar3 = *(undefined8 *)&(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z;
  uVar4 = (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
  local_68._76_8_ = *(undefined8 *)&(ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z;
  local_68.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y =
       (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y;
  local_68.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z =
       (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z;
  local_68.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar3;
  local_68.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = (float)((ulong)uVar3 >> 0x20);
  local_70.bits =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_68.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar5;
  local_68.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar1;
  local_68.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar2;
  local_68.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar4;
  SVar6 = LiRandomWalk(this,&local_68,lambda,(SamplerHandle *)&local_70,scratchBuffer,0);
  b = SampledWavelengths::PDF(lambda);
  SVar6 = SafeDiv(SVar6,b);
  return (array<float,_4>)(array<float,_4>)SVar6;
}

Assistant:

SampledSpectrum Li(RayDifferential ray, SampledWavelengths &lambda,
                       SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                       VisibleSurface *visibleSurface) const {
        SampledSpectrum L = LiRandomWalk(ray, lambda, sampler, scratchBuffer, 0);
        return SafeDiv(L, lambda.PDF());
    }